

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O0

void __thiscall GrcFont::~GrcFont(GrcFont *this)

{
  long *in_RDI;
  GrcFont *in_stack_ffffffffffffff98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb0;
  
  CloseFile(in_stack_ffffffffffffff98);
  if (*in_RDI != 0) {
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete__((void *)*in_RDI);
    }
    *in_RDI = 0;
  }
  if ((in_RDI[2] != 0) && ((void *)in_RDI[2] != (void *)0x0)) {
    operator_delete__((void *)in_RDI[2]);
  }
  if ((in_RDI[4] != 0) && ((void *)in_RDI[4] != (void *)0x0)) {
    operator_delete__((void *)in_RDI[4]);
  }
  if ((in_RDI[6] != 0) && ((void *)in_RDI[6] != (void *)0x0)) {
    operator_delete__((void *)in_RDI[6]);
  }
  if ((in_RDI[8] != 0) && ((void *)in_RDI[8] != (void *)0x0)) {
    operator_delete__((void *)in_RDI[8]);
  }
  if ((in_RDI[10] != 0) && ((void *)in_RDI[10] != (void *)0x0)) {
    operator_delete__((void *)in_RDI[10]);
  }
  if ((in_RDI[0xc] != 0) && ((void *)in_RDI[0xc] != (void *)0x0)) {
    operator_delete__((void *)in_RDI[0xc]);
  }
  if ((in_RDI[0xe] != 0) &&
     (in_stack_ffffffffffffffb0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI[0xe]
     , in_stack_ffffffffffffffb0 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)) {
    operator_delete__(in_stack_ffffffffffffffb0);
  }
  if ((in_RDI[0x10] != 0) && ((void *)in_RDI[0x10] != (void *)0x0)) {
    operator_delete__((void *)in_RDI[0x10]);
  }
  if ((in_RDI[0x12] != 0) && ((void *)in_RDI[0x12] != (void *)0x0)) {
    operator_delete__((void *)in_RDI[0x12]);
  }
  if ((in_RDI[0x14] != 0) && ((void *)in_RDI[0x14] != (void *)0x0)) {
    operator_delete__((void *)in_RDI[0x14]);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffffb0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffffb0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

GrcFont::~GrcFont()
{
	CloseFile();
	if (m_pchFileName)
	{
		delete [] m_pchFileName;
		m_pchFileName = NULL;
	}
	if (m_pCmap)
		delete [] m_pCmap;
	if (m_pGlyf)
		delete [] m_pGlyf;
	if (m_pHead)
		delete [] m_pHead;
	if (m_pHhea)
		delete [] m_pHhea;
	if (m_pHmtx)
		delete [] m_pHmtx;
	if (m_pLoca)
		delete [] m_pLoca;
	if (m_pMaxp)
		delete [] m_pMaxp;
	if (m_pOs2)
		delete [] m_pOs2;
	if (m_pPost)
		delete [] m_pPost;
	if (m_pName)
		delete [] m_pName;
}